

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sstring_view.hpp
# Opt level: O1

int __thiscall
pstore::sstring_view<char_const*>::compare<char_const*>(sstring_view<char_const*> *this,char **s)

{
  char cVar1;
  char *__s;
  ulong uVar2;
  bool bVar3;
  size_t sVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  
  __s = *s;
  sVar4 = strlen(__s);
  uVar2 = *(ulong *)(this + 8);
  uVar6 = uVar2;
  if (sVar4 < uVar2) {
    uVar6 = sVar4;
  }
  bVar3 = true;
  if (uVar6 == 0) {
    uVar5 = 0;
  }
  else {
    uVar7 = 0;
    uVar5 = 0;
    do {
      cVar1 = __s[uVar7];
      if (*(char *)(*(long *)this + uVar7) < cVar1) {
        uVar5 = 0xffffffff;
LAB_001c01de:
        bVar3 = false;
        break;
      }
      if (cVar1 < *(char *)(*(long *)this + uVar7)) {
        uVar5 = 1;
        goto LAB_001c01de;
      }
      uVar7 = uVar7 + 1;
    } while (uVar6 != uVar7);
  }
  if ((bVar3) && (uVar5 = 0, uVar2 != sVar4)) {
    uVar5 = -(uint)(uVar2 < sVar4) | 1;
  }
  return uVar5;
}

Assistant:

int sstring_view<PointerType>::compare (StringType const & s) const {
        auto const slen = string_traits<StringType>::length (s);
        size_type const common_len = std::min (size (), slen);
        int result = traits::compare (data (), string_traits<StringType>::data (s), common_len);
        if (result == 0) {
            result = (size () == slen) ? 0 : (size () < slen ? -1 : 1);
        }
        return result;
    }